

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O2

Vec_Ptr_t * Llb_ManComputeCuts(Aig_Man_t *p,int Num,int fVerbose,int fVeryVerbose)

{
  int iVar1;
  int iVar2;
  abctime aVar3;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *pVVar4;
  Vec_Ptr_t *vLower;
  Vec_Ptr_t *vUpper;
  void *Entry;
  abctime aVar5;
  int iVar6;
  int i;
  int iVar7;
  
  iVar7 = p->nObjs[6];
  iVar1 = p->nObjs[5];
  aVar3 = Abc_Clock();
  p_00 = Vec_PtrAlloc(100);
  pVVar4 = Llb_ManComputeCutLo(p);
  Vec_PtrPush(p_00,pVVar4);
  pVVar4 = Llb_ManComputeCutLi(p);
  Vec_PtrPush(p_00,pVVar4);
  pVVar4 = (Vec_Ptr_t *)0x0;
  do {
    vLower = (Vec_Ptr_t *)Vec_PtrEntry(p_00,0);
    iVar6 = p_00->nSize;
    for (i = 1; i < iVar6; i = i + 1) {
      vUpper = (Vec_Ptr_t *)Vec_PtrEntry(p_00,i);
      iVar2 = Llb_ManCutVolume(p,vLower,vUpper);
      if ((iVar7 + iVar1) / Num < iVar2) {
        if (fVeryVerbose != 0) {
          Llb_ManCutPrint(p,vLower,vUpper);
        }
        pVVar4 = Llb_ManFlowFindBestCut(p,vLower,vUpper,Num);
        if (pVVar4 != (Vec_Ptr_t *)0x0) {
          if (fVeryVerbose != 0) {
            Llb_ManCutPrint(p,pVVar4,vUpper);
            Llb_ManCutPrint(p,vLower,pVVar4);
            putchar(10);
          }
          break;
        }
        if (fVeryVerbose != 0) {
          puts("Could not break the cut.");
          putchar(10);
        }
        pVVar4 = (Vec_Ptr_t *)0x0;
      }
      vLower = vUpper;
    }
    if (iVar6 == i) {
      if (fVerbose != 0) {
        iVar7 = 0x7d640e;
        printf("Finished computing %d partitions.  ",(ulong)(iVar6 - 1));
        aVar5 = Abc_Clock();
        Abc_Print(iVar7,"%s =","Time");
        Abc_Print(iVar7,"%9.2f sec\n",(double)(aVar5 - aVar3) / 1000000.0);
        Llb_ManResultPrint(p,p_00);
      }
      return p_00;
    }
    Vec_PtrPush(p_00,(void *)0x0);
    for (iVar6 = p_00->nSize + -2; i < iVar6 + 1; iVar6 = iVar6 + -1) {
      Entry = Vec_PtrEntry(p_00,iVar6);
      Vec_PtrWriteEntry(p_00,iVar6 + 1,Entry);
    }
    Vec_PtrWriteEntry(p_00,i,pVVar4);
  } while( true );
}

Assistant:

Vec_Ptr_t * Llb_ManComputeCuts( Aig_Man_t * p, int Num, int fVerbose, int fVeryVerbose )
{
    int nVolMax = Aig_ManNodeNum(p) / Num;
    Vec_Ptr_t * vResult, * vMinCut = NULL, * vLower, * vUpper;
    int i, k, nVol;
    abctime clk = Abc_Clock();
    vResult = Vec_PtrAlloc( 100 );
    Vec_PtrPush( vResult, Llb_ManComputeCutLo(p) );
    Vec_PtrPush( vResult, Llb_ManComputeCutLi(p) );
    while ( 1 ) 
    {
        // find a place to insert new cut
        vLower = (Vec_Ptr_t *)Vec_PtrEntry( vResult, 0 );
        Vec_PtrForEachEntryStart( Vec_Ptr_t *, vResult, vUpper, i, 1 )
        {
            nVol = Llb_ManCutVolume( p, vLower, vUpper );
            if ( nVol <= nVolMax )
            {
                vLower = vUpper;
                continue;
            }

            if ( fVeryVerbose )
            Llb_ManCutPrint( p, vLower,  vUpper );
            vMinCut = Llb_ManFlowFindBestCut( p, vLower, vUpper, Num );
            if ( vMinCut == NULL )
            {
                if ( fVeryVerbose )
                printf( "Could not break the cut.\n" );
                if ( fVeryVerbose )
                printf( "\n" );
                vLower = vUpper;
                continue;
            }

            if ( fVeryVerbose )
            Llb_ManCutPrint( p, vMinCut, vUpper );
            if ( fVeryVerbose )
            Llb_ManCutPrint( p, vLower,  vMinCut );
            if ( fVeryVerbose )
            printf( "\n" );

            break;
        }
        if ( i == Vec_PtrSize(vResult) )
            break;
        // insert vMinCut before vUpper
        Vec_PtrPush( vResult, NULL );
        for ( k = Vec_PtrSize(vResult) - 1; k > i; k-- )
            Vec_PtrWriteEntry( vResult, k, Vec_PtrEntry(vResult, k-1) );
        Vec_PtrWriteEntry( vResult, i, vMinCut );
    }
    if ( fVerbose )
    {
        printf( "Finished computing %d partitions.  ", Vec_PtrSize(vResult) - 1 );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        Llb_ManResultPrint( p, vResult );
    }
    return vResult;
}